

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O2

RowVector __thiscall
rek::Solver::solve(Solver *this,SparseMatrix<double,_1,_int> *A,Matrix<double,__1,_1,_0,__1,_1> *b,
                  long maxIterations,double tolerance)

{
  Scalar SVar1;
  Index reserveSize;
  Scalar *pSVar2;
  Index extraout_RDX;
  long k;
  long outer;
  RowVector RVar3;
  InnerIterator it;
  SparseMatrix<double,_0,_int> AColMajor;
  InnerIterator local_a0;
  SparseMatrix<double,_0,_int> local_78;
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix
            (&local_78,
             (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
             (Index)b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data);
  reserveSize = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::nonZeros
                          ((SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *)b);
  Eigen::SparseMatrix<double,_0,_int>::reserve(&local_78,reserveSize);
  for (outer = 0;
      outer < (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      outer = outer + 1) {
    Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::InnerIterator::InnerIterator
              (&local_a0,(SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_> *)b,outer);
    for (; local_a0.m_id < local_a0.m_end; local_a0.m_id = local_a0.m_id + 1) {
      SVar1 = local_a0.m_values[local_a0.m_id];
      pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert
                         (&local_78,local_a0.m_outer.m_value,(long)local_a0.m_indices[local_a0.m_id]
                         );
      *pSVar2 = SVar1;
    }
  }
  solve(this,A,(SparseMatrix<double,_0,_int> *)b,(RowVector *)&local_78,maxIterations,tolerance);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&local_78);
  RVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  RVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (RowVector)RVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

RowVector solve(SparseMatrix<double, RowMajor> &A,
                  const Matrix<double, Dynamic, 1> &b, long maxIterations,
                  double tolerance = tolerance_) const {
    SparseMatrix<double, ColMajor> AColMajor(A.rows(), A.cols());

    // Copy row major to column major sparse matrix
    AColMajor.reserve(A.nonZeros());
    for (long k = 0; k < A.outerSize(); ++k)
      for (SparseMatrix<double, RowMajor>::InnerIterator it(A, k); it; ++it) {
        AColMajor.insert(it.row(), it.col()) = it.value();
      }

    return solve(A, AColMajor, b, maxIterations, tolerance);
  }